

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O2

void __thiscall
icu_63::RBBITableBuilder::addRuleRootNodes(RBBITableBuilder *this,UVector *dest,RBBINode *node)

{
  while ((node != (RBBINode *)0x0 && (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR))) {
    if (node->fRuleRoot != '\0') {
      UVector::addElement(dest,node,this->fStatus);
      return;
    }
    addRuleRootNodes(this,dest,node->fLeftChild);
    node = node->fRightChild;
  }
  return;
}

Assistant:

void RBBITableBuilder::addRuleRootNodes(UVector *dest, RBBINode *node) {
    if (node == NULL || U_FAILURE(*fStatus)) {
        return;
    }
    if (node->fRuleRoot) {
        dest->addElement(node, *fStatus);
        // Note: rules cannot nest. If we found a rule start node,
        //       no child node can also be a start node.
        return;
    }
    addRuleRootNodes(dest, node->fLeftChild);
    addRuleRootNodes(dest, node->fRightChild);
}